

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O1

SUNErrCode SUNDataNode_GetChild(SUNDataNode self,sundataindex index,SUNDataNode *child_node)

{
  _func_SUNErrCode_SUNDataNode_sundataindex_SUNDataNode_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->getchild;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNDataNode_sundataindex_SUNDataNode_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,index,child_node);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNDataNode_GetChild(const SUNDataNode self, sundataindex index,
                                SUNDataNode* child_node)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->getchild)
  {
    SUNErrCode err = self->ops->getchild(self, index, child_node);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}